

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  streamoff sVar1;
  ssize_t sVar2;
  fstream *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  fpos<__mbstate_t> local_48;
  fpos<__mbstate_t> local_38;
  undefined8 local_28;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *vector_local;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_local;
  pos_type pos_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  __nbytes_00 = &this->stream_;
  vector_local = (vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)this;
  this_local = (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)__buf;
  pos_local._M_off = __nbytes;
  sVar1 = std::fpos::operator_cast_to_long((fpos *)&this_local);
  std::fpos<__mbstate_t>::fpos(&local_48,sVar1 * 0x38);
  sVar1 = std::fpos::operator_cast_to_long((fpos *)&local_48);
  local_38 = std::fpos<__mbstate_t>::operator+(&this->data_begin_,sVar1);
  std::istream::seekg(&this->stream_,local_38._M_off,local_38._M_state);
  check_stream(this,"seekg for vector read");
  sVar2 = read(this,(int)local_28,__buf_00,(size_t)__nbytes_00);
  return sVar2;
}

Assistant:

void read(std::vector<value_type>& vector, pos_type pos)
    {
        stream_.seekg(data_begin_ + static_cast<pos_type>(pos * value_size));
        check_stream("seekg for vector read");
        read(vector);
    }